

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::visit(FunctionResolver *this,CallOrCast *call)

{
  size_t *psVar1;
  Allocator *pAVar2;
  CommaSeparatedList *pCVar3;
  pointer pPVar4;
  size_t sVar5;
  pool_ref<soul::AST::Expression> *ppVar6;
  long *plVar7;
  undefined8 uVar8;
  ArrayWithPreallocation<soul::Identifier,_8UL> *pAVar9;
  Type *pTVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  TypeCast *pTVar14;
  QualifiedIdentifier *name;
  Expression *pEVar15;
  StaticAssertion *pSVar16;
  bool ignoreErrorsInGenerics;
  size_t sVar17;
  pool_ref<soul::AST::Function> *ppVar18;
  pool_ref<soul::AST::Function> *extraout_RDX;
  pool_ref<soul::AST::Function> *extraout_RDX_00;
  pool_ref<soul::AST::Expression> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  PossibleFunction *f;
  long lVar19;
  CallOrCast *pCVar20;
  CallOrCast *call_00;
  ulong uVar21;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions_00;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> args;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL> functions;
  pool_ptr<soul::AST::Expression> resolved;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> possibles;
  long local_2d8;
  char *local_2d0;
  char *local_2c8;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_2b8;
  undefined1 local_280 [24];
  SanityCheckPass local_268 [32];
  TypeArray local_248;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> local_170;
  string local_118;
  string local_f8;
  string local_d8;
  Type local_b8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,call);
  pEVar15 = (call->nameOrType).object;
  if ((pEVar15->kind == type) &&
     (iVar13 = (*(pEVar15->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
     (char)iVar13 != '\0')) {
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    (*(((call->nameOrType).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])(&local_b8);
    pTVar14 = convertToCast(pAVar2,call,&local_b8);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_b8.structure.object);
    return &pTVar14->super_Expression;
  }
  pCVar3 = (call->super_CallOrCastBase).arguments.object;
  if ((((pCVar3 != (CommaSeparatedList *)0x0) &&
       (iVar13 = (*(pCVar3->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(),
       (char)iVar13 == '\0')) || (pEVar15 = (call->nameOrType).object, pEVar15 == (Expression *)0x0)
      ) || (name = (QualifiedIdentifier *)
                   __dynamic_cast(pEVar15,&AST::Expression::typeinfo,
                                  &AST::QualifiedIdentifier::typeinfo,0),
           name == (QualifiedIdentifier *)0x0)) goto LAB_00213ba9;
  pCVar20 = (CallOrCast *)&name->pathPrefix;
  IdentifierPath::operator+
            ((IdentifierPath *)&local_248,(IdentifierPath *)pCVar20,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  bVar11 = IdentifierPath::isUnqualifiedName((IdentifierPath *)&local_248,"advance");
  local_248.numActive = 0;
  if ((8 < local_248.numAllocated) && ((CallOrCast *)local_248.items != (CallOrCast *)0x0)) {
    operator_delete__(local_248.items);
  }
  if (bVar11) {
    pEVar15 = createAdvanceCall(this,call);
    return pEVar15;
  }
  IdentifierPath::operator+
            ((IdentifierPath *)&local_248,(IdentifierPath *)pCVar20,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  bVar11 = IdentifierPath::isUnqualifiedName((IdentifierPath *)&local_248,"static_assert");
  local_248.numActive = 0;
  if ((8 < local_248.numAllocated) && ((CallOrCast *)local_248.items != (CallOrCast *)0x0)) {
    operator_delete__(local_248.items);
  }
  if (bVar11) {
    pCVar3 = (call->super_CallOrCastBase).arguments.object;
    if (pCVar3 != (CommaSeparatedList *)0x0) {
      pAVar2 = (Allocator *)(pCVar3->items).items;
      args.e = in_R8;
      args.s = (pool_ref<soul::AST::Expression> *)
               (&(pAVar2->pool).pools.
                 super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (pCVar3->items).numActive);
      pSVar16 = ASTUtilities::createStaticAssertion
                          ((ASTUtilities *)
                           &(call->super_CallOrCastBase).super_Expression.super_Statement.
                            super_ASTObject.context,
                           (Context *)(this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                           pAVar2,args);
      return &pSVar16->super_Expression;
    }
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  IdentifierPath::operator+
            ((IdentifierPath *)&local_248,(IdentifierPath *)pCVar20,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  bVar11 = IdentifierPath::isUnqualifiedName((IdentifierPath *)&local_248,"at");
  local_248.numActive = 0;
  if ((8 < local_248.numAllocated) && ((CallOrCast *)local_248.items != (CallOrCast *)0x0)) {
    operator_delete__(local_248.items);
  }
  if (bVar11) {
    pEVar15 = createAtCall(this,call);
    return pEVar15;
  }
  pPVar4 = (name->pathSections).
           super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(name->pathSections).
             super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 != 0x60) ||
     ((pPVar4->specialisationArgs).object != (Expression *)0x0)) goto LAB_00213ba9;
  pCVar3 = (call->super_CallOrCastBase).arguments.object;
  if ((pCVar3 != (CommaSeparatedList *)0x0) && (sVar5 = (pCVar3->items).numActive, sVar5 != 0)) {
    ppVar6 = (pCVar3->items).items;
    lVar19 = 0;
    do {
      plVar7 = *(long **)((long)&ppVar6->object + lVar19);
      if (((int)plVar7[5] != 0) || (cVar12 = (**(code **)(*plVar7 + 0x18))(), cVar12 == '\0')) {
        if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors != false) goto LAB_00213ba9;
        SanityCheckPass::throwErrorIfNotReadableValue
                  (*(Expression **)((long)&ppVar6->object + lVar19));
      }
      lVar19 = lVar19 + 8;
    } while (sVar5 << 3 != lVar19);
  }
  findAllPossibleFunctions(&local_170,this,call,name);
  sVar5 = local_170.numActive;
  if (local_170.numActive == 0) {
LAB_00213d24:
    local_2d0 = (char *)0x0;
    bVar11 = false;
LAB_00213d49:
    local_2b8.items = (pool_ref<soul::AST::Expression> *)local_2b8.space;
    local_2b8.numAllocated = 4;
    local_2b8.numActive = 0;
    if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false) {
LAB_00213d51:
      throwErrorForUnknownFunction(this,call,name);
LAB_00213d5f:
      if (local_170.numActive == 0) {
        ppVar18 = (pool_ref<soul::AST::Function> *)0x0;
      }
      else {
        lVar19 = 0;
        ppVar18 = (pool_ref<soul::AST::Function> *)0x0;
        do {
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((ulong)*(byte *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->
                                           super_Expression).super_Statement.super_ASTObject.
                                           objectType + lVar19) ^ 1);
          if (*(char *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->super_Expression).
                               super_Statement.super_ASTObject.objectType + lVar19 + 1) == '\0') {
            in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          ppVar18 = (pool_ref<soul::AST::Function> *)((long)&ppVar18->object + (long)in_R9);
          lVar19 = lVar19 + 0x10;
        } while (local_170.numActive << 4 != lVar19);
      }
      if ((long)&ppVar18->object + (long)local_2d0 == 0) {
        if (bVar11) {
          if (local_170.numActive == 0) {
            throwInternalCompilerError("! empty()","front",0xa7);
          }
          if (*(byte *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->super_Expression).
                               super_Statement.super_ASTObject.objectType + 2) != 0) {
            if (1 < local_2b8.numActive) goto LAB_0021400d;
            goto LAB_00214107;
          }
          AST::Function::getParameterTypes
                    (&local_248,
                     (Function *)
                     (((CallOrCastBase *)&(local_170.items)->function)->super_Expression).
                     super_Statement.super_ASTObject._vptr_ASTObject);
          pCVar3 = (call->super_CallOrCastBase).arguments.object;
          if (pCVar3 == (CommaSeparatedList *)0x0) {
            sVar17 = 0;
          }
          else {
            sVar17 = (pCVar3->items).numActive;
          }
          if (local_248.numActive != sVar17) {
            throwInternalCompilerError("paramTypes.size() == call.getNumArguments()","visit",0x920);
          }
          if (local_248.numActive != 0) {
            local_2d8 = 0;
            local_2c8 = "operator->";
            local_2d0 = "object != nullptr";
            uVar21 = 0;
            do {
              pCVar3 = (call->super_CallOrCastBase).arguments.object;
              if (pCVar3 == (CommaSeparatedList *)0x0) {
                iVar13 = 0x3c;
LAB_0021428e:
                throwInternalCompilerError(local_2d0,local_2c8,iVar13);
              }
              if ((pCVar3->items).numActive <= uVar21) {
                iVar13 = 0x9e;
                local_2d0 = "index < numActive";
                local_2c8 = "operator[]";
                goto LAB_0021428e;
              }
              pAVar9 = (ArrayWithPreallocation<soul::Identifier,_8UL> *)&(local_248.items)->category
              ;
              (*(((pCVar3->items).items[uVar21].object)->super_Statement).super_ASTObject.
                _vptr_ASTObject[4])(local_280);
              bVar11 = TypeRules::canPassAsArgumentTo
                                 ((Type *)((long)&pAVar9->items + local_2d8),(Type *)local_280,true)
              ;
              RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_280._16_8_);
              if (!bVar11) {
                pCVar3 = (call->super_CallOrCastBase).arguments.object;
                if (pCVar3 == (CommaSeparatedList *)0x0) {
                  iVar13 = 0x3c;
LAB_002142bc:
                  throwInternalCompilerError(local_2d0,local_2c8,iVar13);
                }
                iVar13 = 0x9e;
                if (((pCVar3->items).numActive <= uVar21) || (local_248.numActive <= uVar21)) {
                  local_2d0 = "index < numActive";
                  local_2c8 = "operator[]";
                  goto LAB_002142bc;
                }
                pEVar15 = (pCVar3->items).items[uVar21].object;
                SanityCheckPass::expectSilentCastPossible
                          (&(pEVar15->super_Statement).super_ASTObject.context,
                           (Type *)((long)&((ArrayWithPreallocation<soul::Identifier,_8UL> *)
                                           &(local_248.items)->category)->items + local_2d8),pEVar15
                          );
              }
              uVar21 = uVar21 + 1;
              local_2d8 = local_2d8 + 0x18;
            } while (uVar21 < local_248.numActive);
          }
          ArrayWithPreallocation<soul::Type,_8UL>::clear(&local_248);
          ppVar18 = extraout_RDX;
        }
        if ((sVar5 == 0) || (local_2b8.numActive < 2)) {
LAB_00214107:
          IdentifierPath::operator+
                    ((IdentifierPath *)&local_248,(IdentifierPath *)pCVar20,
                     &((name->pathSections).
                       super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                       ._M_impl.super__Vector_impl_data._M_start)->path);
          IdentifierPath::toString_abi_cxx11_(&local_d8,(IdentifierPath *)&local_248);
          AST::CallOrCastBase::getDescription
                    ((string *)local_280,&call->super_CallOrCastBase,&local_d8);
          CompileMessageHelpers::createMessage<std::__cxx11::string>
                    (&local_68,(CompileMessageHelpers *)0x1,none,0x2a15c2,local_280,in_R9);
          AST::Context::throwError
                    (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                      context,&local_68,false);
        }
LAB_0021400d:
        local_280._0_8_ = local_268;
        local_280._8_8_ = 0;
        local_280._16_8_ = 4;
        if (local_170.numActive != 0) {
          lVar19 = 0;
          do {
            uVar8 = *(undefined8 *)
                     ((long)&(((CallOrCastBase *)&(local_170.items)->function)->super_Expression).
                             super_Statement.super_ASTObject._vptr_ASTObject + lVar19);
            ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL>::reserve
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL> *)local_280
                       ,local_280._8_8_ + 1);
            *(undefined8 *)(local_280._0_8_ + local_280._8_8_ * 8) = uVar8;
            local_280._8_8_ = local_280._8_8_ + 1;
            lVar19 = lVar19 + 0x10;
            ppVar18 = extraout_RDX_00;
          } while (local_170.numActive << 4 != lVar19);
        }
        functions_00.e = ppVar18;
        functions_00.s = (pool_ref<soul::AST::Function> *)(local_280._0_8_ + local_280._8_8_ * 8);
        SanityCheckPass::checkForDuplicateFunctions((SanityCheckPass *)local_280._0_8_,functions_00)
        ;
        IdentifierPath::operator+
                  ((IdentifierPath *)&local_248,(IdentifierPath *)pCVar20,
                   &((name->pathSections).
                     super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                     ._M_impl.super__Vector_impl_data._M_start)->path);
        IdentifierPath::toString_abi_cxx11_(&local_118,(IdentifierPath *)&local_248);
        AST::CallOrCastBase::getDescription(&local_f8,&call->super_CallOrCastBase,&local_118);
        CompileMessageHelpers::createMessage<std::__cxx11::string>
                  (&local_a0,(CompileMessageHelpers *)0x1,none,0x2a1658,(char *)&local_f8,in_R9);
        AST::Context::throwError
                  (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                    context,&local_a0,false);
      }
      if ((1 < sVar5) || (1 < local_2b8.numActive)) goto LAB_0021400d;
    }
LAB_00213dc7:
    bVar11 = true;
LAB_00213dca:
    local_2b8.numActive = 0;
    if (4 < local_2b8.numAllocated) {
      if (local_2b8.items != (pool_ref<soul::AST::Expression> *)0x0) {
        operator_delete__(local_2b8.items);
      }
      local_2b8.numAllocated = 4;
    }
  }
  else {
    local_2d8 = local_170.numActive << 4;
    lVar19 = 0;
    do {
      if (*(char *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->super_Expression).
                           super_Statement.super_ASTObject.objectType + lVar19 + 3) != '\0') {
        bVar11 = false;
        pCVar20 = call;
        goto LAB_00213ef4;
      }
      lVar19 = lVar19 + 0x10;
    } while (local_2d8 != lVar19);
    bVar11 = local_170.numActive == 1;
    ignoreErrorsInGenerics = SUB81(call,0);
    if (bVar11) {
      if ((char)(((CallOrCastBase *)&(local_170.items)->function)->super_Expression).super_Statement
                .super_ASTObject.objectType != Graph) goto LAB_00213cac;
      resolveFunction((FunctionResolver *)&local_248,(PossibleFunction *)this,
                      (CallOrCast *)local_170.items,ignoreErrorsInGenerics);
    }
    else {
      if (local_170.numActive == 0) goto LAB_00213d24;
LAB_00213cac:
      lVar19 = 0;
      local_2d0 = (char *)0x0;
      do {
        if ((*(char *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->super_Expression).
                              super_Statement.super_ASTObject.objectType + lVar19) == '\0') &&
           (*(char *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->super_Expression).
                             super_Statement.super_ASTObject.objectType + lVar19 + 1) == '\0')) {
          local_2d0 = (char *)((long)local_2d0 +
                              ((ulong)*(byte *)((long)&(((CallOrCastBase *)
                                                        &(local_170.items)->function)->
                                                       super_Expression).super_Statement.
                                                       super_ASTObject.objectType + lVar19 + 2) ^ 1)
                              );
        }
        lVar19 = lVar19 + 0x10;
      } while (local_2d8 != lVar19);
      if (local_2d0 != (char *)0x1) {
        local_2b8.items = (pool_ref<soul::AST::Expression> *)local_2b8.space;
        local_2b8.numActive = 0;
        local_2b8.numAllocated = 4;
        call_00 = (CallOrCast *)local_170.items;
        if (local_170.numActive == 0) goto LAB_00213d49;
        do {
          if (((char)(call_00->super_CallOrCastBase).super_Expression.super_Statement.
                     super_ASTObject.objectType == Graph) &&
             (*(byte *)((long)&(call_00->super_CallOrCastBase).super_Expression.super_Statement.
                               super_ASTObject.objectType + 2) == 1)) {
            resolveFunction((FunctionResolver *)&local_248,(PossibleFunction *)this,call_00,
                            ignoreErrorsInGenerics);
            pTVar10 = local_248.items;
            if ((CallOrCast *)local_248.items == (CallOrCast *)0x0) {
              iVar13 = (*(this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.
                         _vptr_RewritingASTVisitor[0x38])();
              if ((char)iVar13 == '\0') {
                bVar11 = false;
                pCVar20 = call;
                goto LAB_00213dca;
              }
            }
            else {
              ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                        (&local_2b8,local_2b8.numActive + 1);
              local_2b8.items[local_2b8.numActive] = (pool_ref<soul::AST::Expression>)pTVar10;
              local_2b8.numActive = local_2b8.numActive + 1;
            }
          }
          call_00 = (CallOrCast *)
                    &(call_00->super_CallOrCastBase).super_Expression.super_Statement.
                     super_ASTObject.context;
          local_2d8 = local_2d8 + -0x10;
        } while (local_2d8 != 0);
        if (local_2b8.numActive != 1) {
          if ((local_2b8.numActive != 0) ||
             ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false)) {
            if (sVar5 == 0) goto LAB_00213d51;
            goto LAB_00213d5f;
          }
          goto LAB_00213dc7;
        }
        bVar11 = false;
        pCVar20 = *(CallOrCast **)local_2b8.items;
        goto LAB_00213dca;
      }
      lVar19 = local_170.numActive << 4;
      pCVar20 = (CallOrCast *)local_170.items;
      while ((((char)(pCVar20->super_CallOrCastBase).super_Expression.super_Statement.
                     super_ASTObject.objectType != Graph ||
              (*(byte *)((long)&(pCVar20->super_CallOrCastBase).super_Expression.super_Statement.
                                super_ASTObject.objectType + 1) != 0)) ||
             (*(byte *)((long)&(pCVar20->super_CallOrCastBase).super_Expression.super_Statement.
                               super_ASTObject.objectType + 2) != 0))) {
        pCVar20 = (CallOrCast *)
                  &(pCVar20->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                   context;
        lVar19 = lVar19 + -0x10;
        if (lVar19 == 0) {
          throwInternalCompilerError("visit",0x900);
        }
      }
      resolveFunction((FunctionResolver *)&local_248,(PossibleFunction *)this,pCVar20,
                      ignoreErrorsInGenerics);
    }
    if ((CallOrCast *)local_248.items == (CallOrCast *)0x0) {
      local_248.items = (Type *)call;
    }
    bVar11 = false;
    pCVar20 = (CallOrCast *)local_248.items;
  }
LAB_00213ef4:
  local_170.numActive = 0;
  if ((4 < local_170.numAllocated) && ((CallOrCast *)local_170.items != (CallOrCast *)0x0)) {
    operator_delete__(local_170.items);
  }
  if (!bVar11) {
    return (Expression *)pCVar20;
  }
LAB_00213ba9:
  psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
  *psVar1 = *psVar1 + 1;
  return (Expression *)call;
}

Assistant:

AST::Expression& visit (AST::CallOrCast& call) override
        {
            super::visit (call);

            if (AST::isResolvedAsType (call.nameOrType.get()))
                return convertToCast (allocator, call, call.nameOrType->resolveAsType());

            if (call.areAllArgumentsResolved())
            {
                if (auto name = cast<AST::QualifiedIdentifier> (call.nameOrType))
                {
                    if (name->getPath().isUnqualifiedName ("advance"))
                        return createAdvanceCall (call);

                    if (name->getPath().isUnqualifiedName ("static_assert"))
                        return ASTUtilities::createStaticAssertion (call.context, allocator, call.arguments->items);

                    if (name->getPath().isUnqualifiedName ("at"))
                        return createAtCall (call);

                    if (! name->isSimplePath())
                    {
                        numFails++;
                        return call;
                    }

                    if (call.arguments != nullptr)
                    {
                        for (auto& arg : call.arguments->items)
                        {
                            if (! AST::isResolvedAsValue (arg.get()))
                            {
                                if (ignoreErrors)
                                {
                                    ++numFails;
                                    return call;
                                }

                                SanityCheckPass::throwErrorIfNotReadableValue (arg);
                            }
                        }
                    }

                    auto possibles = findAllPossibleFunctions (call, *name);

                    for (auto& f : possibles)
                        if (f.functionIsNotResolved)
                            return call;

                    auto totalMatches = possibles.size();

                    // If there's only one function found, and we can call it (maybe with a cast), then go for it..
                    if (totalMatches == 1 && ! possibles.front().isImpossible)
                    {
                        if (auto resolved = resolveFunction (possibles.front(), call, ignoreErrors))
                            return *resolved;

                        return call;
                    }

                    auto exactMatches = countNumberOfExactMatches (possibles);

                    // If there's one exact match, then even if there are others requiring casts, we'll ignore them
                    // and go for the one which is a perfect match..
                    if (exactMatches == 1)
                    {
                        for (auto& f : possibles)
                        {
                            if (f.isExactMatch())
                            {
                                if (auto resolved = resolveFunction (f, call, ignoreErrors))
                                    return *resolved;

                                return call;
                            }
                        }

                        SOUL_ASSERT_FALSE;
                    }

                    // If there are any generic functions, see if exactly one of these works
                    ArrayWithPreallocation<pool_ref<AST::Expression>, 4> matchingGenerics;

                    for (auto& f : possibles)
                    {
                        if (! f.isImpossible && f.requiresGeneric)
                        {
                            if (auto e = resolveFunction (f, call, true))
                                matchingGenerics.push_back (*e);
                            else if (! canResolveGenerics())
                                return call;
                        }
                    }

                    if (matchingGenerics.size() == 1)
                        return matchingGenerics.front();

                    if (! ignoreErrors || matchingGenerics.size() > 1)
                    {
                        if (totalMatches == 0)
                            throwErrorForUnknownFunction (call, *name);

                        auto possibleWithCast = countNumberOfMatchesWithCast (possibles);

                        if (exactMatches + possibleWithCast == 0)
                        {
                            if (totalMatches == 1 && ! possibles.front().requiresGeneric)
                            {
                                auto paramTypes = possibles.front().function.getParameterTypes();
                                SOUL_ASSERT (paramTypes.size() == call.getNumArguments());

                                for (size_t i = 0; i < paramTypes.size(); ++i)
                                    if (! TypeRules::canPassAsArgumentTo (paramTypes[i], call.arguments->items[i]->getResultType(), true))
                                        SanityCheckPass::expectSilentCastPossible (call.arguments->items[i]->context,
                                                                                   paramTypes[i], call.arguments->items[i]);
                            }

                            if (totalMatches == 0 || matchingGenerics.size() <= 1)
                                call.context.throwError (Errors::noMatchForFunctionCall (call.getDescription (name->getPath().toString())));
                        }

                        if (totalMatches > 1 || matchingGenerics.size() > 1)
                        {
                            ArrayWithPreallocation<pool_ref<AST::Function>, 4> functions;

                            for (auto& f : possibles)
                                functions.push_back (f.function);

                            SanityCheckPass::checkForDuplicateFunctions (functions);

                            call.context.throwError (Errors::ambiguousFunctionCall (call.getDescription (name->getPath().toString())));
                        }
                    }
                }
            }

            ++numFails;
            return call;
        }